

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

int yang_print_model_(lyout *out,int level,lys_module *module)

{
  lys_ext *plVar1;
  lys_feature *plVar2;
  lys_ident *plVar3;
  lys_node *plVar4;
  lys_deviation *plVar5;
  lyout *out_00;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int extraout_EAX;
  lys_import *plVar9;
  lys_include *plVar10;
  lys_module *plVar11;
  lys_module *plVar12;
  lys_deviate *plVar13;
  lys_ext_instance **pplVar14;
  long lVar15;
  char *pcVar16;
  uint ext_size;
  ulong uVar17;
  lyout *plVar18;
  ulong uVar19;
  ulong uVar20;
  lys_node **pplVar21;
  undefined8 local_70;
  int flag;
  ulong local_60;
  ulong local_58;
  int local_4c;
  lys_module *plStack_48;
  int flag_1;
  lyout *local_40;
  uint local_34;
  
  pcVar16 = "";
  if ((module->field_0x40 & 0x30) == 0x10) {
    pcVar16 = " // DEVIATED";
  }
  local_58 = (ulong)(level + 1);
  plStack_48 = module;
  local_40 = out;
  if ((module->field_0x40 & 1) == 0) {
    ly_print(out,"%*smodule %s {%s\n",(ulong)(uint)(level * 2),"",module->name,pcVar16);
    bVar6 = (byte)module->field_0x40 >> 1 & 7;
    iVar8 = (int)local_58;
    if (bVar6 != 0) {
      pcVar16 = "1";
      if (bVar6 == 2) {
        pcVar16 = "1.1";
      }
      yang_print_substmt(out,iVar8,LYEXT_SUBSTMT_VERSION,'\0',pcVar16,module,module->ext,
                         (uint)module->ext_size);
    }
    yang_print_substmt(out,iVar8,LYEXT_SUBSTMT_NAMESPACE,'\0',module->ns,module,module->ext,
                       (uint)module->ext_size);
    yang_print_substmt(out,iVar8,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                       (uint)module->ext_size);
    local_34 = iVar8 * 2;
  }
  else {
    ly_print(out,"%*ssubmodule %s {%s\n",(ulong)(uint)(level * 2),"",module->name,pcVar16);
    plVar11 = lys_main_module(module);
    if (((plVar11->field_0x40 & 0xc) != 0) ||
       (iVar8 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_VERSION), iVar8 != -1))
    {
      pcVar16 = "1";
      if (((ulong)module->data->parent & 0xe) == 4) {
        pcVar16 = "1.1";
      }
      yang_print_substmt(out,(int)local_58,LYEXT_SUBSTMT_VERSION,'\0',pcVar16,module,module->ext,
                         (uint)module->ext_size);
    }
    iVar8 = -1;
    local_34 = (int)local_58 * 2;
    ly_print(out,"%*sbelongs-to %s {\n",(ulong)local_34,"");
    while (iVar8 = lys_ext_iter(module->ext,module->ext_size,(char)iVar8 + '\x01',
                                LYEXT_SUBSTMT_BELONGSTO), plVar18 = local_40, iVar8 != -1) {
      yang_print_extension_instances
                (local_40,level + 2,module,LYEXT_SUBSTMT_BELONGSTO,'\0',module->ext + iVar8,1);
    }
    yang_print_substmt(local_40,level + 2,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,
                       module->ext,(uint)module->ext_size);
    ly_print(plVar18,"%*s}\n",(ulong)local_34,"");
  }
  plVar18 = local_40;
  plVar11 = plStack_48;
  _flag = (ulong)(level + 2);
  lVar15 = 0;
  for (uVar19 = 0; out_00 = local_40, uVar20 = _flag, uVar19 < plVar11->imp_size;
      uVar19 = uVar19 + 1) {
    ly_print(plVar18,"\n%*simport %s {\n",(ulong)local_34);
    iVar8 = (int)_flag;
    yang_print_extension_instances
              (plVar18,iVar8,plVar11,LYEXT_SUBSTMT_SELF,'\0',
               *(lys_ext_instance ***)(plVar11->imp->rev + lVar15 + 0x10),
               (uint)(byte)plVar11->imp->rev[lVar15 + 0xb]);
    plVar9 = plVar11->imp;
    yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_PREFIX,'\0',*(char **)(plVar9->rev + lVar15 + -8)
                       ,plVar11,*(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                       (uint)(byte)plVar9->rev[lVar15 + 0xb]);
    plVar9 = plVar11->imp;
    if (plVar9->rev[lVar15] != '\0') {
      yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_REVISIONDATE,'\0',plVar9->rev + lVar15,plVar11,
                         *(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                         (uint)(byte)plVar9->rev[lVar15 + 0xb]);
      plVar9 = plVar11->imp;
    }
    yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                       *(char **)(plVar9->rev + lVar15 + 0x18),plVar11,
                       *(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                       (uint)(byte)plVar9->rev[lVar15 + 0xb]);
    plVar9 = plVar11->imp;
    yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_REFERENCE,'\0',
                       *(char **)(plVar9->rev + lVar15 + 0x20),plVar11,
                       *(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                       (uint)(byte)plVar9->rev[lVar15 + 0xb]);
    ly_print(plVar18,"%*s}\n",(ulong)local_34,"");
    lVar15 = lVar15 + 0x38;
  }
  lVar15 = 0x18;
  for (uVar19 = 0; plVar18 = local_40, plVar11 = plStack_48, uVar19 < plStack_48->inc_size;
      uVar19 = uVar19 + 1) {
    plVar10 = plStack_48->inc;
    if ((((plVar10->rev[lVar15 + -0x18] == '\0') && (*(long *)(plVar10->rev + lVar15) == 0)) &&
        (*(long *)(plVar10->rev + lVar15 + 8) == 0)) && (plVar10->rev[lVar15 + -0xd] == '\0')) {
      ly_print(local_40,"\n%*sinclude \"%s\";\n",(ulong)local_34,"");
    }
    else {
      local_60 = uVar19;
      ly_print(out_00,"\n%*sinclude %s {\n",(ulong)local_34);
      plVar11 = plStack_48;
      iVar8 = (int)uVar20;
      yang_print_extension_instances
                (out_00,iVar8,plStack_48,LYEXT_SUBSTMT_SELF,'\0',
                 *(lys_ext_instance ***)(plStack_48->inc->rev + lVar15 + -8),
                 (uint)(byte)plStack_48->inc->rev[lVar15 + -0xd]);
      plVar10 = plVar11->inc;
      if (plVar10->rev[lVar15 + -0x18] != '\0') {
        pcVar16 = plVar10->rev + lVar15 + -8;
        yang_print_substmt(out_00,iVar8,LYEXT_SUBSTMT_REVISIONDATE,'\0',pcVar16 + -0x10,plVar11,
                           *(lys_ext_instance ***)pcVar16,(uint)(byte)pcVar16[-5]);
        plVar10 = plVar11->inc;
      }
      yang_print_substmt(out_00,iVar8,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                         *(char **)(plVar10->rev + lVar15),plVar11,
                         *(lys_ext_instance ***)(plVar10->rev + lVar15 + -8),
                         (uint)(byte)plVar10->rev[lVar15 + -0xd]);
      plVar10 = plVar11->inc;
      yang_print_substmt(out_00,iVar8,LYEXT_SUBSTMT_REFERENCE,'\0',
                         *(char **)(plVar10->rev + lVar15 + 8),plVar11,
                         *(lys_ext_instance ***)(plVar10->rev + lVar15 + -8),
                         (uint)(byte)plVar10->rev[lVar15 + -0xd]);
      ly_print(out_00,"%*s}\n",(ulong)local_34,"");
      uVar19 = local_60;
    }
    lVar15 = lVar15 + 0x30;
  }
  if (((plStack_48->org == (char *)0x0) && (plStack_48->contact == (char *)0x0)) &&
     ((plStack_48->dsc == (char *)0x0 && (plStack_48->ref == (char *)0x0)))) {
    pcVar16 = (char *)0x0;
  }
  else {
    ly_print(local_40,"\n");
    pcVar16 = plVar11->org;
  }
  iVar8 = (int)local_58;
  yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_ORGANIZATION,'\0',pcVar16,plVar11,plVar11->ext,
                     (uint)plVar11->ext_size);
  yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_CONTACT,'\0',plVar11->contact,plVar11,plVar11->ext,
                     (uint)plVar11->ext_size);
  yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_DESCRIPTION,'\0',plVar11->dsc,plVar11,plVar11->ext,
                     (uint)plVar11->ext_size);
  yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_REFERENCE,'\0',plVar11->ref,plVar11,plVar11->ext,
                     (uint)plVar11->ext_size);
  if (plVar11->rev_size != '\0') {
    ly_print(plVar18,"\n");
  }
  plVar11 = plStack_48;
  lVar15 = 0;
  for (uVar19 = 0; uVar19 < plVar11->rev_size; uVar19 = uVar19 + 1) {
    yang_print_revision(plVar18,(int)local_58,plVar11,(lys_revision *)(plVar11->rev->date + lVar15))
    ;
    lVar15 = lVar15 + 0x28;
  }
  uVar7 = (int)_flag * 2;
  local_60 = (ulong)(level + 3);
  uVar19 = _flag;
  for (uVar20 = 0; uVar20 < plVar11->extensions_size; uVar20 = uVar20 + 1) {
    ly_print(plVar18,"\n");
    plVar1 = plVar11->extensions;
    plVar4 = (lys_node *)(plVar1 + uVar20);
    local_70._0_4_ = 0;
    local_4c = 0;
    ly_print(plVar18,"%*sextension %s",(ulong)local_34,"",plVar1[uVar20].name);
    yang_print_snode_common(plVar18,(int)uVar19,plVar4,plVar1[uVar20].module,(int *)&local_70,1);
    if (plVar1[uVar20].argument != (char *)0x0) {
      yang_print_open(plVar18,(int *)&local_70);
      ly_print(plVar18,"%*sargument %s",(ulong)uVar7,"");
      uVar19 = local_60;
      iVar8 = -1;
      while( true ) {
        iVar8 = lys_ext_iter(plVar4->ext,plVar4->ext_size,(char)iVar8 + '\x01',
                             LYEXT_SUBSTMT_ARGUMENT);
        plVar18 = local_40;
        if (iVar8 == -1) break;
        yang_print_open(local_40,&local_4c);
        yang_print_extension_instances
                  (plVar18,(int)uVar19,plVar4->module,LYEXT_SUBSTMT_ARGUMENT,'\0',
                   plVar4->ext + iVar8,1);
      }
      if (((plVar4->flags & 1) != 0) ||
         (iVar8 = lys_ext_iter(plVar4->ext,plVar4->ext_size,'\0',LYEXT_SUBSTMT_YINELEM), iVar8 != -1
         )) {
        plVar18 = local_40;
        yang_print_open(local_40,&local_4c);
        pcVar16 = "true";
        if ((plVar4->flags & 1) == 0) {
          pcVar16 = "false";
        }
        yang_print_substmt(plVar18,(int)uVar19,LYEXT_SUBSTMT_YINELEM,'\0',pcVar16,plVar4->module,
                           plVar4->ext,(uint)plVar4->ext_size);
      }
      plVar18 = local_40;
      yang_print_close(local_40,(int)_flag,local_4c);
    }
    uVar19 = _flag;
    yang_print_snode_common(plVar18,(int)_flag,plVar4,plVar4->module,(int *)&local_70,0x70);
    yang_print_close(plVar18,(int)local_58,(int)local_70);
    plVar11 = plStack_48;
  }
  if (plVar11->ext_size != '\0') {
    ly_print(plVar18,"\n");
    yang_print_extension_instances
              (plVar18,(int)local_58,plVar11,LYEXT_SUBSTMT_SELF,'\0',plVar11->ext,
               (uint)plVar11->ext_size);
  }
  lVar15 = 0;
  for (uVar19 = 0; uVar19 < plVar11->features_size; uVar19 = uVar19 + 1) {
    ly_print(plVar18,"\n");
    plVar2 = plVar11->features;
    local_70._0_4_ = 0;
    ly_print(local_40,"%*sfeature %s",(ulong)local_34,"",
             *(undefined8 *)(plVar2->padding + lVar15 + -0x1c));
    plVar18 = local_40;
    yang_print_snode_common
              (local_40,(int)_flag,(lys_node *)(plVar2->padding + lVar15 + -0x1c),
               *(lys_module **)(plVar2->padding + lVar15 + 0x14),(int *)&local_70,0x73);
    yang_print_close(plVar18,(int)local_58,(int)local_70);
    lVar15 = lVar15 + 0x40;
  }
  for (uVar19 = 0; plVar11 = plStack_48, uVar19 < plStack_48->ident_size; uVar19 = uVar19 + 1) {
    ly_print(plVar18,"\n");
    plVar3 = plVar11->ident;
    plVar4 = (lys_node *)(plVar3 + uVar19);
    local_4c = 0;
    ly_print(local_40,"%*sidentity %s",(ulong)local_34,"",plVar3[uVar19].name);
    plVar18 = local_40;
    yang_print_snode_common(local_40,(int)_flag,plVar4,plVar3[uVar19].module,&local_4c,3);
    for (uVar20 = 0; uVar20 < plVar4->padding[3]; uVar20 = uVar20 + 1) {
      yang_print_open(plVar18,&local_4c);
      plVar11 = lys_main_module(*(lys_module **)
                                 (*(long *)(*(long *)&plVar4->nodetype + uVar20 * 8) + 0x30));
      plVar12 = lys_main_module(plVar4->module);
      if (plVar12 == plVar11) {
        yang_print_substmt(plVar18,(int)_flag,LYEXT_SUBSTMT_BASE,(uint8_t)uVar20,
                           (char *)**(undefined8 **)(*(long *)&plVar4->nodetype + uVar20 * 8),
                           plVar4->module,plVar4->ext,(uint)plVar4->ext_size);
      }
      else {
        pcVar16 = transform_module_name2import_prefix(plVar4->module,plVar11->name);
        asprintf((char **)&local_70,"%s:%s",pcVar16,
                 **(undefined8 **)(*(long *)&plVar4->nodetype + uVar20 * 8));
        yang_print_substmt(plVar18,(int)_flag,LYEXT_SUBSTMT_BASE,(uint8_t)uVar20,
                           (char *)CONCAT44(local_70._4_4_,(int)local_70),plVar4->module,plVar4->ext
                           ,(uint)plVar4->ext_size);
        free((void *)CONCAT44(local_70._4_4_,(int)local_70));
      }
    }
    yang_print_snode_common(plVar18,(int)_flag,plVar4,plVar4->module,&local_4c,0x70);
    yang_print_close(plVar18,(int)local_58,local_4c);
  }
  lVar15 = 0;
  for (uVar19 = 0; uVar19 < plVar11->tpdf_size; uVar19 = uVar19 + 1) {
    ly_print(plVar18,"\n");
    yang_print_typedef(plVar18,(int)local_58,plVar11,
                       (lys_tpdf *)(plVar11->tpdf->padding + lVar15 + -0x1c));
    lVar15 = lVar15 + 0x80;
  }
  plVar12 = lys_main_module(plVar11);
  uVar19 = local_58;
  pplVar21 = &plVar12->data;
  while( true ) {
    plVar4 = *pplVar21;
    if (plVar4 == (lys_node *)0x0) break;
    if (plVar4->module == plVar11) {
      yang_print_snode(plVar18,(int)uVar19,plVar4,0x800);
    }
    pplVar21 = &plVar4->next;
  }
  plVar12 = lys_main_module(plVar11);
  pplVar21 = &plVar12->data;
  while (plVar4 = *pplVar21, plVar4 != (lys_node *)0x0) {
    if (plVar4->module == plVar11) {
      yang_print_snode(plVar18,(int)uVar19,plVar4,0x903f);
    }
    pplVar21 = &plVar4->next;
  }
  lVar15 = 0;
  for (uVar19 = 0; uVar19 < plVar11->augment_size; uVar19 = uVar19 + 1) {
    ly_print(plVar18,"\n");
    yang_print_augment(plVar18,(int)local_58,
                       (lys_node_augment *)(plVar11->augment->padding + lVar15 + -0x1c));
    lVar15 = lVar15 + 0x68;
  }
  plVar12 = lys_main_module(plVar11);
  uVar19 = local_58;
  pplVar21 = &plVar12->data;
  while( true ) {
    plVar4 = *pplVar21;
    if (plVar4 == (lys_node *)0x0) break;
    if (plVar4->module == plVar11) {
      yang_print_snode(plVar18,(int)uVar19,plVar4,0x4100);
    }
    pplVar21 = &plVar4->next;
  }
  plVar12 = lys_main_module(plVar11);
  pplVar21 = &plVar12->data;
  while (plVar4 = *pplVar21, plVar4 != (lys_node *)0x0) {
    if (plVar4->module == plVar11) {
      yang_print_snode(plVar18,(int)uVar19,plVar4,0x80);
    }
    pplVar21 = &plVar4->next;
  }
  local_58 = CONCAT44(local_58._4_4_,(int)local_60 * 2);
  uVar19 = 0;
  do {
    plVar11 = plStack_48;
    if (plStack_48->deviation_size <= uVar19) {
      ly_print(plVar18,"%*s}\n",(ulong)(local_34 - 2),"");
      ly_print_flush(plVar18);
      return extraout_EAX;
    }
    ly_print(plVar18,"\n");
    plVar5 = plVar11->deviation;
    pcVar16 = transform_json2schema(plStack_48,plVar5[uVar19].target_name);
    ly_print(local_40,"%*sdeviation \"%s\" {\n",(ulong)local_34);
    plVar18 = local_40;
    lydict_remove(plStack_48->ctx,pcVar16);
    plVar11 = plStack_48;
    ext_size = 0;
    iVar8 = (int)_flag;
    if (plVar5[uVar19].ext_size != 0) {
      yang_print_extension_instances
                (plVar18,iVar8,plStack_48,LYEXT_SUBSTMT_SELF,'\0',plVar5[uVar19].ext,
                 (uint)plVar5[uVar19].ext_size);
      ext_size = (uint)plVar5[uVar19].ext_size;
    }
    yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_DESCRIPTION,'\0',plVar5[uVar19].dsc,plVar11,
                       plVar5[uVar19].ext,ext_size);
    yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_REFERENCE,'\0',plVar5[uVar19].ref,plVar11,
                       plVar5[uVar19].ext,(uint)plVar5[uVar19].ext_size);
    for (uVar20 = 0; uVar20 < plVar5[uVar19].deviate_size; uVar20 = uVar20 + 1) {
      ly_print(plVar18,"%*sdeviate ",(ulong)uVar7,"");
      pcVar16 = "add {\n";
      switch(plVar5[uVar19].deviate[uVar20].mod) {
      case LY_DEVIATE_NO:
        pcVar16 = "not-supported {\n";
        if (plVar5[uVar19].deviate[uVar20].ext_size != '\0') break;
        ly_print(plVar18,"not-supported;\n");
        goto LAB_0016bc53;
      case LY_DEVIATE_ADD:
        break;
      case LY_DEVIATE_RPL:
        pcVar16 = "replace {\n";
        break;
      case LY_DEVIATE_DEL:
        pcVar16 = "delete {\n";
        break;
      default:
        goto switchD_0016b89d_default;
      }
      ly_print(plVar18,pcVar16);
switchD_0016b89d_default:
      plVar13 = plVar5[uVar19].deviate;
      if (plVar13[uVar20].ext_size != 0) {
        yang_print_extension_instances
                  (plVar18,(int)local_60,plStack_48,LYEXT_SUBSTMT_SELF,'\0',plVar13[uVar20].ext,
                   (uint)plVar13[uVar20].ext_size);
        plVar13 = plVar5[uVar19].deviate;
      }
      iVar8 = (int)local_60;
      if (plVar13[uVar20].type != (lys_type *)0x0) {
        yang_print_type(plVar18,iVar8,plStack_48,plVar13[uVar20].type);
        plVar13 = plVar5[uVar19].deviate;
      }
      yang_print_substmt(plVar18,iVar8,LYEXT_SUBSTMT_UNITS,'\0',plVar13[uVar20].units,plStack_48,
                         plVar13[uVar20].ext,(uint)plVar13[uVar20].ext_size);
      lVar15 = 0;
      for (uVar17 = 0; plVar13 = plVar5[uVar19].deviate, uVar17 < plVar13[uVar20].must_size;
          uVar17 = uVar17 + 1) {
        yang_print_must(local_40,(int)local_60,plStack_48,
                        (lys_restr *)((long)&(plVar13[uVar20].must)->expr + lVar15));
        lVar15 = lVar15 + 0x38;
      }
      plVar18 = local_40;
      for (uVar17 = 0; uVar17 < plVar13[uVar20].unique_size; uVar17 = uVar17 + 1) {
        yang_print_unique(plVar18,(int)local_60,plVar13[uVar20].unique + uVar17);
        plVar13 = plVar5[uVar19].deviate;
        iVar8 = -1;
        while (iVar8 = lys_ext_iter(plVar13[uVar20].ext,plVar13[uVar20].ext_size,
                                    (char)iVar8 + '\x01',LYEXT_SUBSTMT_UNIQUE), plVar18 = local_40,
              iVar8 != -1) {
          plVar13 = plVar5[uVar19].deviate;
          if (uVar17 == plVar13[uVar20].ext[iVar8]->insubstmt_index) {
            ly_print(local_40," {\n");
            pplVar14 = plVar5[uVar19].deviate[uVar20].ext;
            do {
              yang_print_extension_instances
                        (local_40,level + 4,plStack_48,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar17,
                         pplVar14 + iVar8,1);
              plVar13 = plVar5[uVar19].deviate;
              do {
                iVar8 = lys_ext_iter(plVar13[uVar20].ext,plVar13[uVar20].ext_size,
                                     (char)iVar8 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                plVar18 = local_40;
                if (iVar8 == -1) {
                  ly_print(local_40,"%*s}\n",local_58 & 0xffffffff,"");
                  goto LAB_0016bacd;
                }
                plVar13 = plVar5[uVar19].deviate;
                pplVar14 = plVar13[uVar20].ext;
              } while (uVar17 != pplVar14[iVar8]->insubstmt_index);
            } while( true );
          }
        }
        ly_print(local_40,";\n");
LAB_0016bacd:
        plVar13 = plVar5[uVar19].deviate;
      }
      uVar17 = 0;
      while( true ) {
        if (plVar13[uVar20].dflt_size <= uVar17) break;
        yang_print_substmt(plVar18,(int)local_60,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar17,
                           plVar13[uVar20].dflt[uVar17],plStack_48,plVar13[uVar20].ext,
                           (uint)plVar13[uVar20].ext_size);
        uVar17 = uVar17 + 1;
        plVar13 = plVar5[uVar19].deviate;
      }
      pcVar16 = "true";
      if (((plVar13[uVar20].flags & 1) != 0) ||
         (pcVar16 = "false", (plVar13[uVar20].flags & 2) != 0)) {
        yang_print_substmt(plVar18,(int)local_60,LYEXT_SUBSTMT_CONFIG,'\0',pcVar16,plStack_48,
                           plVar13->ext,(uint)plVar13[uVar20].ext_size);
      }
      plVar13 = plVar5[uVar19].deviate;
      pcVar16 = "true";
      if (((plVar13[uVar20].flags & 0x40) != 0) ||
         (pcVar16 = "false", (char)plVar13[uVar20].flags < '\0')) {
        yang_print_substmt(plVar18,(int)local_60,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar16,plStack_48,
                           plVar13[uVar20].ext,(uint)plVar13[uVar20].ext_size);
      }
      plVar13 = plVar5[uVar19].deviate;
      if (plVar13[uVar20].min_set != '\0') {
        yang_print_unsigned(plVar18,(int)local_60,LYEXT_SUBSTMT_MIN,'\0',plStack_48,
                            plVar13[uVar20].ext,(uint)plVar13[uVar20].ext_size,plVar13[uVar20].min);
        plVar13 = plVar5[uVar19].deviate;
      }
      if (plVar13[uVar20].max_set != '\0') {
        if (plVar13[uVar20].max == 0) {
          yang_print_substmt(plVar18,(int)local_60,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plStack_48,
                             plVar13[uVar20].ext,(uint)plVar13[uVar20].ext_size);
        }
        else {
          yang_print_unsigned(plVar18,(int)local_60,LYEXT_SUBSTMT_MAX,'\0',plStack_48,
                              plVar13[uVar20].ext,(uint)plVar13[uVar20].ext_size,plVar13[uVar20].max
                             );
        }
      }
      ly_print(plVar18,"%*s}\n",(ulong)uVar7,"");
LAB_0016bc53:
    }
    ly_print(plVar18,"%*s}\n",(ulong)local_34,"");
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

static int
yang_print_model_(struct lyout *out, int level, const struct lys_module *module)
{
    unsigned int i;
    int p;

    struct lys_node *node;

    /* (sub)module-header-stmts */
    if (module->type) {
        ly_print(out, "%*ssubmodule %s {%s\n", LEVEL, INDENT, module->name,
                 (module->deviated == 1 ? " // DEVIATED" : ""));
        level++;
        if (lys_main_module(module)->version > 1 ||
                lys_ext_iter(module->ext, module->ext_size, 0, LYEXT_SUBSTMT_VERSION) != -1) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0,
                               ((struct lys_submodule *)module)->belongsto->version == 2 ? "1.1" : "1",
                               module, module->ext, module->ext_size);
        }
        ly_print(out, "%*sbelongs-to %s {\n", LEVEL, INDENT, ((struct lys_submodule *)module)->belongsto->name);
        p = -1;
        while ((p = lys_ext_iter(module->ext, module->ext_size, p + 1, LYEXT_SUBSTMT_BELONGSTO)) != -1) {
            yang_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_BELONGSTO, 0, &module->ext[p], 1);
        }
        yang_print_substmt(out, level + 1, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    } else {
        ly_print(out, "%*smodule %s {%s\n", LEVEL, INDENT, module->name,
                 (module->deviated == 1 ? " // DEVIATED" : ""));
        level++;
        if (module->version) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0, module->version == 2 ? "1.1" : "1",
                               module, module->ext, module->ext_size);
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_NAMESPACE, 0, module->ns,
                           module, module->ext, module->ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
    }

    /* linkage-stmts */
    for (i = 0; i < module->imp_size; i++) {
        ly_print(out, "\n%*simport %s {\n", LEVEL, INDENT, module->imp[i].module->name);
        level++;
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                       module->imp[i].ext, module->imp[i].ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->imp[i].prefix,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        if (module->imp[i].rev[0]) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->imp[i].rev,
                               module, module->imp[i].ext, module->imp[i].ext_size);
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->imp[i].dsc,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->imp[i].ref,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        level--;
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    }
    for (i = 0; i < module->inc_size; i++) {
        if (module->inc[i].rev[0] || module->inc[i].dsc || module->inc[i].ref || module->inc[i].ext_size) {
            ly_print(out, "\n%*sinclude %s {\n", LEVEL, INDENT, module->inc[i].submodule->name);
            level++;
            yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                           module->inc[i].ext, module->inc[i].ext_size);
            if (module->inc[i].rev[0]) {
                yang_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->inc[i].rev,
                                   module, module->inc[i].ext, module->inc[i].ext_size);
            }
            yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->inc[i].dsc,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->inc[i].ref,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            level--;
            ly_print(out, "%*s}\n", LEVEL, INDENT);
        } else {
            ly_print(out, "\n%*sinclude \"%s\";\n", LEVEL, INDENT, module->inc[i].submodule->name);
        }
    }

    /* meta-stmts */
    if (module->org || module->contact || module->dsc || module->ref) {
        ly_print(out, "\n");
    }
    yang_print_substmt(out, level, LYEXT_SUBSTMT_ORGANIZATION, 0, module->org,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_CONTACT, 0, module->contact,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->dsc,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->ref,
                       module, module->ext, module->ext_size);

    /* revision-stmts */
    if (module->rev_size) {
        ly_print(out, "\n");
    }
    for (i = 0; i < module->rev_size; i++) {
        yang_print_revision(out, level, module, &module->rev[i]);
    }

    /* body-stmts */
    for (i = 0; i < module->extensions_size; i++) {
        ly_print(out, "\n");
        yang_print_extension(out, level, &module->extensions[i]);
    }
    if (module->ext_size) {
        ly_print(out, "\n");
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, module->ext, module->ext_size);
    }

    for (i = 0; i < module->features_size; i++) {
        ly_print(out, "\n");
        yang_print_feature(out, level, &module->features[i]);
    }

    for (i = 0; i < module->ident_size; i++) {
        ly_print(out, "\n");
        yang_print_identity(out, level, &module->ident[i]);
    }

    for (i = 0; i < module->tpdf_size; i++) {
        ly_print(out, "\n");
        yang_print_typedef(out, level, module, &module->tpdf[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_GROUPING);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                             LYS_USES | LYS_ANYDATA);
    }

    for (i = 0; i < module->augment_size; i++) {
        ly_print(out, "\n");
        yang_print_augment(out, level, &module->augment[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_RPC | LYS_ACTION);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_NOTIF);
    }

    for (i = 0; i < module->deviation_size; ++i) {
        ly_print(out, "\n");
        yang_print_deviation(out, level, module, &module->deviation[i]);
    }

    level--;
    ly_print(out, "%*s}\n", LEVEL, INDENT);
    ly_print_flush(out);

    return EXIT_SUCCESS;
}